

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_GetObjectSize
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject,CK_ULONG_PTR pulSize)

{
  char cVar1;
  Session *this_00;
  Token *pTVar2;
  long *plVar3;
  CK_RV CVar4;
  
  CVar4 = 400;
  if (this->isInitialised == true) {
    if (pulSize == (CK_ULONG_PTR)0x0) {
      CVar4 = 7;
    }
    else {
      this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
      if (this_00 == (Session *)0x0) {
        CVar4 = 0xb3;
      }
      else {
        pTVar2 = Session::getToken(this_00);
        if (pTVar2 == (Token *)0x0) {
          CVar4 = 5;
        }
        else {
          plVar3 = (long *)HandleManager::getObject(this->handleManager,hObject);
          CVar4 = 0x82;
          if (plVar3 != (long *)0x0) {
            cVar1 = (**(code **)(*plVar3 + 0x50))(plVar3);
            if (cVar1 != '\0') {
              *pulSize = 0xffffffffffffffff;
              CVar4 = 0;
            }
          }
        }
      }
    }
  }
  return CVar4;
}

Assistant:

CK_RV SoftHSM::C_GetObjectSize(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject, CK_ULONG_PTR pulSize)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pulSize == NULL) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check the object handle.
	OSObject *object = (OSObject *)handleManager->getObject(hObject);
	if (object == NULL_PTR || !object->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	*pulSize = CK_UNAVAILABLE_INFORMATION;

	return CKR_OK;
}